

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

void __thiscall
CTcParser::add_inherited_templates
          (CTcParser *this,CTcSymObj *sc_sym,CTcObjTemplateItem *item_head,size_t item_cnt)

{
  CTcSymObj *in_RDX;
  inh_tpl_entry **in_RSI;
  CTcObjTemplate *in_RDI;
  CTcParser *unaff_retaddr;
  CTcObjTemplate *tpl;
  inh_tpl_entry *cur;
  inh_tpl_entry *tail;
  inh_tpl_entry *head;
  CTcObjTemplate *local_40;
  long local_38;
  CTcObjTemplate *sc_tpl;
  
  sc_tpl = in_RDI;
  build_super_template_list(unaff_retaddr,(inh_tpl_entry **)in_RDI,in_RSI,in_RDX);
  for (local_38 = 0; local_38 != 0; local_38 = *(long *)(local_38 + 8)) {
    expand_and_add_inherited_template
              ((CTcParser *)cur,(CTcSymObj *)tpl,(CTcObjTemplateItem *)unaff_retaddr,sc_tpl);
  }
  for (local_40 = in_RDI[0x11].nxt_; local_40 != (CTcObjTemplate *)0x0; local_40 = local_40->nxt_) {
    expand_and_add_inherited_template
              ((CTcParser *)cur,(CTcSymObj *)tpl,(CTcObjTemplateItem *)unaff_retaddr,sc_tpl);
  }
  expand_and_add_inherited_template
            ((CTcParser *)cur,(CTcSymObj *)tpl,(CTcObjTemplateItem *)unaff_retaddr,sc_tpl);
  return;
}

Assistant:

void CTcParser::add_inherited_templates(CTcSymObj *sc_sym,
                                        CTcObjTemplateItem *item_head,
                                        size_t item_cnt)
{
    inh_tpl_entry *head;
    inh_tpl_entry *tail;
    inh_tpl_entry *cur;
    CTcObjTemplate *tpl;
    
    /* start with an empty list */
    head = tail = 0;

    /* 
     *   traverse the superclass tree, building a list of all unique
     *   templates inherited from the tree 
     */
    build_super_template_list(&head, &tail, sc_sym);

    /* expand our template for each item in the superclass template list */
    for (cur = head ; cur != 0 ; cur = cur->nxt)
        expand_and_add_inherited_template(sc_sym, item_head, cur->tpl);

    /* expand our template for each item in the root template list */
    for (tpl = template_head_ ; tpl != 0 ; tpl = tpl->nxt_)
        expand_and_add_inherited_template(sc_sym, item_head, tpl);

    /* 
     *   finally, add the trivial expansion (in other words, with the
     *   'inherited' keyword replaced by nothing) 
     */
    expand_and_add_inherited_template(sc_sym, item_head, 0);
}